

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.h
# Opt level: O3

error keeprefcount(context *ctx,token *token,opcode *op)

{
  int iVar1;
  ulong *in_RCX;
  token local_48;
  
  iVar1 = equal((token *)op,".KEEPREFCOUNT");
  if (iVar1 != 0) {
    if ((*in_RCX & 0x20) != 0) {
      __assert_fail("(value & bits) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ReinUsesLisp[P]nxas/src/opcode.h"
                    ,0x31,"void opcode::add_bits(uint64_t)");
    }
    *in_RCX = *in_RCX | 0x20;
    context::tokenize(&local_48,(context *)token);
    *(int *)&op[2].value = local_48.column;
    op[1].value = (uint64_t)local_48.data.string._M_str;
    op[1].reuse = local_48.type;
    op[1].sched = (anon_union_4_2_f99a8bb9_for_sched)local_48.line;
    op->value = (uint64_t)local_48.filename;
    op->reuse = local_48.data.predicate.index;
    op->sched = (anon_union_4_2_f99a8bb9_for_sched)local_48.data.predicate.negated;
  }
  ctx->pc = 0;
  return (unique_ptr<char[],_std::default_delete<char[]>_>)
         (unique_ptr<char[],_std::default_delete<char[]>_>)ctx;
}

Assistant:

DEFINE_OPERAND(store_cache)
{
    static const char* table[] = {"", "CG", "CS", "WT", nullptr};
    std::optional<uint64_t> cache = find_in_table(token, table, ".");
    if (cache) {
        token = ctx.tokenize();
    }
    op.add_bits(cache.value_or(0) << address);
    return {};
}